

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

void dwt_calc_explicit_stepsizes(opj_tccp_t *tccp,int prec)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  double dVar14;
  
  OVar1 = tccp->numresolutions;
  uVar6 = OVar1 * 3 - 2;
  if (0 < (int)uVar6) {
    OVar2 = tccp->qmfbid;
    OVar3 = tccp->qntsty;
    uVar13 = 0;
    do {
      uVar9 = 0;
      iVar7 = 0;
      if (uVar13 != 0) {
        iVar7 = (int)uVar13 + -1;
        uVar9 = ~(iVar7 / 3);
        iVar7 = iVar7 % 3 + 1;
      }
      iVar5 = 2 - (uint)(iVar7 - 1U < 2);
      if (iVar7 == 0) {
        iVar5 = 0;
      }
      if (OVar2 == 0) {
        iVar5 = 0;
      }
      dVar14 = 8192.0;
      if (OVar3 != 0) {
        dVar14 = (double)(0x2000 << ((byte)iVar5 & 0x1f)) /
                 dwt_norms_real[iVar7][(int)(uVar9 + (OVar1 - 1))];
      }
      dVar14 = floor(dVar14);
      uVar12 = (uint)dVar14;
      iVar7 = 0;
      uVar9 = 0;
      if (1 < (int)uVar12) {
        iVar7 = 0;
        uVar9 = uVar12;
        do {
          iVar7 = iVar7 + -1;
          bVar4 = 3 < uVar9;
          uVar9 = uVar9 >> 1;
        } while (bVar4);
        uVar9 = uVar12;
        iVar11 = -0xb;
        do {
          iVar10 = iVar11;
          iVar11 = iVar10 + 1;
          bVar4 = 3 < uVar9;
          uVar9 = uVar9 >> 1;
        } while (bVar4);
        bVar8 = (byte)iVar11;
        uVar9 = uVar12 << (-bVar8 & 0x1f);
        if (10 < iVar10 + 0xbU) {
          uVar9 = uVar12 >> (bVar8 & 0x1f);
        }
        uVar9 = uVar9 & 0x7ff;
      }
      tccp->stepsizes[uVar13].mant = uVar9;
      tccp->stepsizes[uVar13].expn = iVar5 + prec + 0xd + iVar7;
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar6);
  }
  return;
}

Assistant:

void dwt_calc_explicit_stepsizes(opj_tccp_t * tccp, int prec) {
	int numbands, bandno;
	numbands = 3 * tccp->numresolutions - 2;
	for (bandno = 0; bandno < numbands; bandno++) {
		double stepsize;
		int resno, level, orient, gain;

		resno = (bandno == 0) ? 0 : ((bandno - 1) / 3 + 1);
		orient = (bandno == 0) ? 0 : ((bandno - 1) % 3 + 1);
		level = tccp->numresolutions - 1 - resno;
		gain = (tccp->qmfbid == 0) ? 0 : ((orient == 0) ? 0 : (((orient == 1) || (orient == 2)) ? 1 : 2));
		if (tccp->qntsty == J2K_CCP_QNTSTY_NOQNT) {
			stepsize = 1.0;
		} else {
			double norm = dwt_norms_real[orient][level];
			stepsize = (1 << (gain)) / norm;
		}
		dwt_encode_stepsize((int) floor(stepsize * 8192.0), prec + gain, &tccp->stepsizes[bandno]);
	}
}